

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

bool __thiscall
mp::internal::TextReader<fmt::Locale>::DoReadOptionalInt<int>
          (TextReader<fmt::Locale> *this,int *value)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  uint in_EAX;
  int iVar4;
  UInt result;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  SkipSpace(this);
  pcVar2 = (this->super_ReaderBase).ptr_;
  cVar1 = *pcVar2;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    (this->super_ReaderBase).ptr_ = pcVar2 + 1;
  }
  uStack_28 = (ulong)(uint)uStack_28;
  bVar3 = ReadIntWithoutSign<unsigned_int>(this,(uint *)((long)&uStack_28 + 4));
  if (bVar3) {
    if ((long)uStack_28 < 0) {
      ReportError<>(this,(CStringRef)0x13581b);
    }
    iVar4 = -uStack_28._4_4_;
    if (cVar1 != '-') {
      iVar4 = uStack_28._4_4_;
    }
    *value = iVar4;
  }
  return bVar3;
}

Assistant:

bool DoReadOptionalInt(Int &value) {
    SkipSpace();
    char sign = *ptr_;
    if (sign == '+' || sign == '-')
      ++ptr_;
    typedef typename MakeUnsigned<Int>::Type UInt;
    UInt result = 0;
    if (!ReadIntWithoutSign<UInt>(result))
      return false;
    UInt max = std::numeric_limits<Int>::max();
    if (result > max && !(sign == '-' && result == max + 1))
      ReportError("number is too big");
    value = sign != '-' ? result : 0 - result;
    return true;
  }